

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Matchers::Impl::StdString::EndsWith::toString_abi_cxx11_
          (string *__return_storage_ptr__,EndsWith *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  EndsWith *local_18;
  EndsWith *this_local;
  
  local_18 = this;
  this_local = (EndsWith *)__return_storage_ptr__;
  std::operator+(&local_38,"ends with: \"",&this->m_substr);
  std::operator+(__return_storage_ptr__,&local_38,"\"");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string toString() const {
                return "ends with: \"" + m_substr + "\"";
            }